

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleDependenciesTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test::iterate
          (MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test *this)

{
  GLuint *pGVar1;
  ostringstream *this_00;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  TestError *this_01;
  undefined4 uVar5;
  long lVar6;
  uint uVar7;
  GLint gl_max_internalformat_samples;
  int local_1bc;
  MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test *local_1b8;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  initInternals(this);
  local_1bc = 0;
  pGVar1 = &this->to_id;
  uVar7 = 0xfffffffb;
  lVar6 = 0;
  local_1b8 = this;
  do {
    uVar5 = *(undefined4 *)((long)&DAT_01b1f960 + lVar6);
    (**(code **)(lVar4 + 0x880))(0x9100,uVar5,0x80a9,1,&local_1bc);
    dVar3 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar3,
                    "Could not retrieve maximum supported amount of samples for internal format",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                    ,0x642);
    if (1 < local_1bc) {
      (**(code **)(lVar4 + 0x1390))(0x9100,local_1bc,uVar5,2,2,0);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"glTexStorage2DMultisample() call generated an unexpected error.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                      ,0x651);
      uVar5 = 0x821a;
      if (lVar6 == 0xc) {
        uVar5 = 0x8d00;
      }
      if (uVar7 < 0xfffffffe) {
        uVar5 = 0x8ce0;
      }
      (**(code **)(lVar4 + 0x6b8))(0x8ca9,uVar5,*pGVar1,0,0);
      iVar2 = (**(code **)(lVar4 + 0x800))();
      if (iVar2 != 0x502) {
        local_1b0._0_8_ =
             ((local_1b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        this_00 = (ostringstream *)(local_1b0 + 8);
        std::__cxx11::ostringstream::ostringstream(this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,"An unexpected error code ",0x19);
        std::ostream::_M_insert<unsigned_long>((ulong)this_00);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_00,
                   " instead of GL_INVALID_OPERATION was generated by an invalid glFramebufferTextureLayer() call"
                   ,0x5d);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_00);
        std::ios_base::~ios_base(local_138);
        this_01 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_01,"Invalid error code reported by glFramebufferTextureLayer() call.",
                   (char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                   ,0x665);
        __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      (**(code **)(lVar4 + 0x480))(1,pGVar1);
      (**(code **)(lVar4 + 0x6f8))(1,pGVar1);
      (**(code **)(lVar4 + 0xb8))(0x9100,*pGVar1);
      dVar3 = (**(code **)(lVar4 + 0x800))();
      glu::checkError(dVar3,"Could not re-create the texture object.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleDependenciesTests.cpp"
                      ,0x66d);
    }
    uVar7 = uVar7 + 1;
    lVar6 = lVar6 + 4;
    if (lVar6 == 0x18) {
      tcu::TestContext::setTestResult
                ((local_1b8->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureDependenciesInvalidFramebufferTextureLayerCalls1Test::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* For storing format specific maximum number of samples */
	glw::GLint gl_max_internalformat_samples = 0;

	/* Iterate through all internalformats to be used for the test */
	const glw::GLenum internalformats[] = {
		GL_RGB8, GL_RGB565, GL_SRGB8_ALPHA8, GL_DEPTH_COMPONENT32F, GL_DEPTH24_STENCIL8, GL_RGBA32I
	};
	const unsigned int n_internalformats = sizeof(internalformats) / sizeof(internalformats[0]);

	for (unsigned int n_internalformat = 0; n_internalformat < n_internalformats; ++n_internalformat)
	{
		glw::GLenum internalformat		= internalformats[n_internalformat];
		bool		is_color_renderable = false;
		bool		is_depth_renderable = false;

		if (internalformat == GL_DEPTH_COMPONENT32F)
		{
			is_depth_renderable = true;
		}
		else if (internalformat != GL_DEPTH24_STENCIL8)
		{
			is_color_renderable = true;
		}

		/* Determine a value to be used for samples argument in subsequent
		 * glTexStorage2DMultisample() call. */
		gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE, internalformat, GL_SAMPLES, 1,
							   &gl_max_internalformat_samples);

		GLU_EXPECT_NO_ERROR(gl.getError(),
							"Could not retrieve maximum supported amount of samples for internal format");

		glw::GLint samples = gl_max_internalformat_samples;

		/* Skip formats that are not multisampled in implementation */
		if (samples <= 1)
		{
			continue;
		}

		/* Set the texture object storage up */
		gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, samples, internalformat, 2, /* width */
								   2,													  /* height */
								   GL_FALSE);											  /* fixedsamplelocations */

		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2DMultisample() call generated an unexpected error.");

		/* Try to issue the invalid glFramebufferTextureLayer() call */
		glw::GLenum attachment = (is_color_renderable) ?
									 GL_COLOR_ATTACHMENT0 :
									 (is_depth_renderable) ? GL_DEPTH_ATTACHMENT : GL_DEPTH_STENCIL_ATTACHMENT;

		gl.framebufferTextureLayer(GL_DRAW_FRAMEBUFFER, attachment, to_id, 0, /* level */
								   0);										  /* layer */

		/* Make sure GL_INVALID_OPERATION error was generated */
		glw::GLenum error_code = gl.getError();

		if (error_code != GL_INVALID_OPERATION)
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message << "An unexpected error code " << error_code
				<< " instead of GL_INVALID_OPERATION was generated by an invalid glFramebufferTextureLayer() call"
				<< tcu::TestLog::EndMessage;

			TCU_FAIL("Invalid error code reported by glFramebufferTextureLayer() call.");
		}

		/* Re-create the texture object */
		gl.deleteTextures(1, &to_id);
		gl.genTextures(1, &to_id);
		gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not re-create the texture object.");
	} /* for (all internalformats) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}